

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadlocal-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase33::run(TestCase33 *this)

{
  uint *in_RSI;
  char *pcVar1;
  bool threadDone;
  uint *p;
  ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
  *local_60;
  uint j;
  uint i;
  Own<kj::Function<void_()>::Iface> local_50;
  Thread local_40;
  
  p = _::ThreadLocalPtr::operator_cast_to_unsigned_int_((ThreadLocalPtr *)this);
  if ((p != (uint *)0x0) && (_::Debug::minSeverity < 3)) {
    local_60 = (ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
                *)0x0;
    pcVar1 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
    ;
    in_RSI = (uint *)0x24;
    _::Debug::log<char_const(&)[34],decltype(nullptr),unsigned_int*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
               ,0x24,ERROR,"\"failed: expected \" \"(nullptr) == (p)\", nullptr, p",
               (char (*) [34])"failed: expected (nullptr) == (p)",&local_60,&p);
    this = (TestCase33 *)pcVar1;
  }
  p = _::ThreadLocalPtr::operator_cast_to_unsigned_int_((ThreadLocalPtr *)this);
  if ((p != (uint *)0x0) && (_::Debug::minSeverity < 3)) {
    local_60 = (ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
                *)0x0;
    in_RSI = (uint *)0x26;
    _::Debug::log<char_const(&)[34],decltype(nullptr),unsigned_int*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
               ,0x26,ERROR,"\"failed: expected \" \"(nullptr) == (p)\", nullptr, p",
               (char (*) [34])"failed: expected (nullptr) == (p)",&local_60,&p);
  }
  i = 0x7b;
  pcVar1 = (char *)&i;
  _::ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>::
  operator=((ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
             *)&i,in_RSI);
  p = _::ThreadLocalPtr::operator_cast_to_unsigned_int_((ThreadLocalPtr *)pcVar1);
  if (((ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
        *)&i != (ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
                 *)p) && (_::Debug::minSeverity < 3)) {
    pcVar1 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
    ;
    local_60 = (ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
                *)&i;
    _::Debug::log<char_const(&)[29],unsigned_int*,unsigned_int*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
               ,0x2d,ERROR,"\"failed: expected \" \"(&i) == (p)\", &i, p",
               (char (*) [29])"failed: expected (&i) == (p)",(uint **)&local_60,&p);
  }
  p = _::ThreadLocalPtr::operator_cast_to_unsigned_int_((ThreadLocalPtr *)pcVar1);
  if ((p != (uint *)0x0) && (_::Debug::minSeverity < 3)) {
    local_60 = (ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
                *)0x0;
    _::Debug::log<char_const(&)[34],decltype(nullptr),unsigned_int*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
               ,0x2f,ERROR,"\"failed: expected \" \"(nullptr) == (p)\", nullptr, p",
               (char (*) [34])"failed: expected (nullptr) == (p)",&local_60,&p);
  }
  j = 0x1c8;
  threadDone = false;
  local_50.ptr = (Iface *)operator_new(0x20);
  (local_50.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00421c10;
  local_50.ptr[1]._vptr_Iface = (_func_int **)&p;
  local_50.ptr[2]._vptr_Iface = (_func_int **)&j;
  local_50.ptr[3]._vptr_Iface = (_func_int **)&threadDone;
  local_50.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase33::run()::$_0>>
        ::instance;
  Thread::Thread(&local_40,(Function<void_()> *)&local_50);
  Thread::~Thread(&local_40);
  pcVar1 = (char *)&local_50;
  Own<kj::Function<void_()>::Iface>::dispose((Own<kj::Function<void_()>::Iface> *)pcVar1);
  if ((threadDone == false) && (_::Debug::minSeverity < 3)) {
    pcVar1 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
    ;
    _::Debug::log<char_const(&)[28]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
               ,0x3d,ERROR,"\"failed: expected \" \"threadDone\"",
               (char (*) [28])"failed: expected threadDone");
  }
  p = _::ThreadLocalPtr::operator_cast_to_unsigned_int_((ThreadLocalPtr *)pcVar1);
  if (((ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
        *)&i != (ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
                 *)p) && (_::Debug::minSeverity < 3)) {
    local_60 = (ThreadLocalPtr<unsigned_int,_kj::(anonymous_namespace)::(anonymous_namespace)::_kj_TlpTag30>
                *)&i;
    _::Debug::log<char_const(&)[29],unsigned_int*,unsigned_int*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"(&i) == (p)\", &i, p",
               (char (*) [29])"failed: expected (&i) == (p)",(uint **)&local_60,&p);
  }
  return;
}

Assistant:

TEST(ThreadLocal, Basic) {
  // Verify that both started out null.
  uint* p = tls1;
  EXPECT_EQ(nullptr, p);
  p = tls2;
  EXPECT_EQ(nullptr, p);

  // Set tls1, then verify that only tls1 changed, not tls2.
  uint i = 123;
  tls1 = &i;

  p = tls1;
  EXPECT_EQ(&i, p);
  p = tls2;
  EXPECT_EQ(nullptr, p);

  // Check that in another thread, tls1 starts null but can be changed.
  uint j = 456;
  bool threadDone = false;
  Thread([&]() {
    p = tls1;
    EXPECT_EQ(nullptr, p);
    tls1 = &j;

    p = tls1;
    EXPECT_EQ(&j, p);
    threadDone = true;
  });
  EXPECT_TRUE(threadDone);

  // tls1 didn't change in this thread.
  p = tls1;
  EXPECT_EQ(&i, p);
}